

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::map_onto<int>(Omega_h *this,Read<int> *a_data,Graph *a2b,LO nb,int init_val,Int width)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> out;
  allocator local_b1;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Graph local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_b1);
  Write<int>::Write(&local_b0,nb * width,init_val,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Write<int>::Write(&local_80,&a_data->write_);
  Graph::Graph(&local_70,a2b);
  Write<int>::Write(&local_90,&local_b0);
  map_into<int>((Read<int> *)&local_80,&local_70,&local_90,width);
  Write<int>::~Write(&local_90);
  Graph::~Graph(&local_70);
  Write<int>::~Write(&local_80);
  Write<int>::Write(&local_a0,&local_b0);
  Read<int>::Read((Read<signed_char> *)this,&local_a0);
  Write<int>::~Write(&local_a0);
  Write<int>::~Write(&local_b0);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> map_onto(Read<T> a_data, Graph a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  map_into(a_data, a2b, out, width);
  return out;
}